

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

bool __thiscall anon_unknown.dwarf_448ecb::Db::parsePositiveInteger(Db *this,size_t *Out)

{
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  char *pcVar4;
  long lVar5;
  
  *Out = 0;
  pcVar4 = this->First;
  pcVar1 = this->Last;
  bVar3 = true;
  if (((pcVar1 != pcVar4) && ('/' < *pcVar4)) && ((pcVar1 == pcVar4 || (*pcVar4 < ':')))) {
    pcVar4 = this->First;
    while (((pcVar1 != pcVar4 && ('/' < *pcVar4)) && ((pcVar1 == pcVar4 || (*pcVar4 < ':'))))) {
      sVar2 = *Out;
      *Out = sVar2 * 10;
      if (pcVar4 == pcVar1) {
        lVar5 = -0x30;
      }
      else {
        this->First = pcVar4 + 1;
        lVar5 = (long)*pcVar4 + -0x30;
        pcVar4 = pcVar4 + 1;
      }
      *Out = lVar5 + sVar2 * 10;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Db::parsePositiveInteger(size_t *Out) {
  *Out = 0;
  if (look() < '0' || look() > '9')
    return true;
  while (look() >= '0' && look() <= '9') {
    *Out *= 10;
    *Out += static_cast<size_t>(consume() - '0');
  }
  return false;
}